

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void duckdb::Prefix::Free(ART *art,Node *node)

{
  type paVar1;
  IndexPointer ptr_p;
  Prefix prefix;
  Prefix PStack_48;
  
  ptr_p.data = (node->super_IndexPointer).data;
  if ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000) {
    do {
      Prefix(&PStack_48,art,(Node)ptr_p.data,true,false);
      ptr_p.data = ((PStack_48.ptr)->super_IndexPointer).data;
      paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      FixedSizeAllocator::Free
                ((FixedSizeAllocator *)
                 paVar1->_M_elems[0].
                 super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>,
                 (IndexPointer)(node->super_IndexPointer).data);
      (node->super_IndexPointer).data = ptr_p.data;
    } while ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000);
  }
  Node::Free(art,node);
  (node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Prefix::Free(ART &art, Node &node) {
	Node next;

	while (node.HasMetadata() && node.GetType() == PREFIX) {
		Prefix prefix(art, node, true);
		next = *prefix.ptr;
		Node::GetAllocator(art, PREFIX).Free(node);
		node = next;
	}

	Node::Free(art, node);
	node.Clear();
}